

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell-interface.h
# Opt level: O0

void __thiscall
wasm::ShellExternalInterface::ShellExternalInterface
          (ShellExternalInterface *this,
          map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
          *linkedInstances_)

{
  map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
  local_48;
  map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
  *local_18;
  map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
  *linkedInstances__local;
  ShellExternalInterface *this_local;
  
  local_48._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_48._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_48._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_48._M_t._M_impl._0_8_ = 0;
  local_48._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_48._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_18 = linkedInstances_;
  linkedInstances__local =
       (map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
        *)this;
  std::
  map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
  ::map(&local_48);
  ModuleRunnerBase<wasm::ModuleRunner>::ExternalInterface::ExternalInterface
            (&this->super_ExternalInterface,&local_48);
  std::
  map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
  ::~map(&local_48);
  (this->super_ExternalInterface)._vptr_ExternalInterface =
       (_func_int **)&PTR__ShellExternalInterface_0043c950;
  std::
  map<wasm::Name,_wasm::ShellExternalInterface::Memory,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::ShellExternalInterface::Memory>_>_>
  ::map(&this->memories);
  std::
  unordered_map<wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>_>_>
  ::unordered_map(&this->tables);
  std::
  map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
  ::map(&this->linkedInstances);
  std::
  map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
  ::swap(&this->linkedInstances,linkedInstances_);
  return;
}

Assistant:

ShellExternalInterface(
    std::map<Name, std::shared_ptr<ModuleRunner>> linkedInstances_ = {}) {
    linkedInstances.swap(linkedInstances_);
  }